

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_2::anon_unknown_0::readTile<Imf_3_2::TiledInputFile>
               (TiledInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Header *pHVar7;
  long lVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  int x;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int y;
  int iVar14;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  FrameBuffer i;
  allocator_type local_68 [56];
  
  Imf_3_2::TiledInputFile::header();
  piVar6 = (int *)Imf_3_2::Header::dataWindow();
  iVar3 = piVar6[2];
  iVar12 = *piVar6;
  iVar1 = Imf_3_2::TiledInputFile::numXLevels();
  iVar2 = Imf_3_2::TiledInputFile::numYLevels();
  Imf_3_2::TiledInputFile::header();
  piVar6 = (int *)Imf_3_2::Header::tileDescription();
  pHVar7 = (Header *)Imf_3_2::TiledInputFile::header();
  lVar8 = Imf_3_2::calculateBytesPerPixel(pHVar7);
  __n = ((long)iVar3 - (long)iVar12) + 1;
  if ((!reduceMemory) ||
     ((lVar8 * __n < 0x7a1201 && (lVar8 * (ulong)(uint)(piVar6[1] * *piVar6) < 0xf4241)))) {
    i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
    i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
              (&halfChannels,__n,local_68);
    std::vector<float,_std::allocator<float>_>::vector
              (&floatChannels,__n,(allocator_type *)local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&uintChannels,__n,(allocator_type *)local_68);
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var9 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    uVar13 = 0;
    for (; p_Var10 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end(), p_Var9 != p_Var10;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      iVar3 = (int)uVar13 + (int)(uVar13 / 3) * -3;
      if (iVar3 == 2) {
LAB_00114371:
        Imf_3_2::Slice::Slice
                  ((Slice *)local_68,UINT,
                   (char *)(uintChannels.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                           -(iVar12 / *(int *)&p_Var9[9].field_0x4)),4,0,
                   *(int *)&p_Var9[9].field_0x4,*(int *)&p_Var9[9]._M_parent,0.0,false,false);
        Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var9 + 1));
      }
      else {
        if (iVar3 == 1) {
          Imf_3_2::Slice::Slice
                    ((Slice *)local_68,FLOAT,
                     (char *)(floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                             -(iVar12 / *(int *)&p_Var9[9].field_0x4)),4,0,
                     *(int *)&p_Var9[9].field_0x4,*(int *)&p_Var9[9]._M_parent,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var9 + 1));
          goto LAB_00114371;
        }
        Imf_3_2::Slice::Slice
                  ((Slice *)local_68,HALF,
                   (char *)(halfChannels.
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                           -(iVar12 / *(int *)&p_Var9[9].field_0x4)),2,0,
                   *(int *)&p_Var9[9].field_0x4,*(int *)&p_Var9[9]._M_parent,0.0,false,false);
        Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var9 + 1));
      }
      uVar13 = (ulong)((int)uVar13 + 1);
    }
    Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)in);
    iVar3 = 0;
    if (0 < iVar2) {
      do {
        if (0 < iVar1) {
          iVar12 = 0;
          do {
            iVar14 = 0;
            while( true ) {
              iVar11 = (int)in;
              iVar4 = Imf_3_2::TiledInputFile::numYTiles(iVar11);
              if (iVar4 <= iVar14) break;
              for (iVar4 = 0; iVar5 = Imf_3_2::TiledInputFile::numXTiles(iVar11), iVar4 < iVar5;
                  iVar4 = iVar4 + 1) {
                Imf_3_2::TiledInputFile::readTile(iVar11,iVar4,iVar14,iVar12);
              }
              iVar14 = iVar14 + 1;
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 != iVar1);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != iVar2);
    }
    if (uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)uintChannels.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)uintChannels.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(halfChannels.
                      super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)halfChannels.
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)halfChannels.
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&i);
  }
  return false;
}

Assistant:

bool
readTile (T& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    try
    {
        const Box2i& dw = in.header ().dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int dwx        = dw.min.x;
        int numXLevels = in.numXLevels ();
        int numYLevels = in.numYLevels ();

        const TileDescription& td    = in.header ().tileDescription ();
        uint64_t               bytes = calculateBytesPerPixel (in.header ());

        if (reduceMemory && (w * bytes > gMaxBytesPerScanline ||
                             (td.xSize * td.ySize * bytes) > gMaxTileBytes))
        {
            return false;
        }

        FrameBuffer i;
        // read all channels present (later channels will overwrite earlier ones)
        vector<half>         halfChannels (w);
        vector<float>        floatChannels (w);
        vector<unsigned int> uintChannels (w);

        int                channelIndex = 0;
        const ChannelList& channelList  = in.header ().channels ();
        for (ChannelList::ConstIterator c = channelList.begin ();
             c != channelList.end ();
             ++c)
        {
            switch (channelIndex % 3)
            {
                case 0:
                    i.insert (
                        c.name (),
                        Slice (
                            HALF,
                            (char*) &halfChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (half),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                    break;
                case 1:
                    i.insert (
                        c.name (),
                        Slice (
                            FLOAT,
                            (char*) &floatChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (float),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                case 2:
                    i.insert (
                        c.name (),
                        Slice (
                            UINT,
                            (char*) &uintChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (unsigned int),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                    break;
            }
            channelIndex++;
        }

        in.setFrameBuffer (i);

        size_t step = 1;

        size_t tileIndex = 0;
        bool   isRipMap  = td.mode == RIPMAP_LEVELS;

        //
        // read all tiles from all levels.
        //
        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                for (int y = 0; y < in.numYTiles (ylevel); ++y)
                {
                    for (int x = 0; x < in.numXTiles (xlevel); ++x)
                    {
                        if (tileIndex % step == 0)
                        {
                            try
                            {
                                in.readTile (x, y, xlevel, ylevel);
                            }
                            catch (...)
                            {
                                //
                                // for one level and mipmapped images,
                                // xlevel must match ylevel,
                                // otherwise an exception is thrown
                                // ignore that exception
                                //
                                if (isRipMap || xlevel == ylevel)
                                {
                                    threw = true;

                                    //
                                    // in reduceTime mode, fail immediately - the file is corrupt
                                    //
                                    if (reduceTime) { return threw; }
                                }
                            }
                        }
                        tileIndex++;
                    }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }

    return threw;
}